

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_cont_mgau.c
# Opt level: O1

int32 approx_cont_mgau_frame_eval
                (mdef_t *mdef,subvq_t *svq,gs_t *gs,mgau_model_t *g,fast_gmm_t *fastgmm,ascr_t *a,
                float32 *feat,int32 frame,int32 *cache_ci_senscr,ptmr_t *tm_ovrhd,logmath_t *logmath
                )

{
  float fVar1;
  int32 svq_beam;
  int iVar2;
  int32 *piVar3;
  s3senid_t *psVar4;
  int32 *senscr;
  uint8 *puVar5;
  uint8 *puVar6;
  int *__base;
  gmm_select_t *pgVar7;
  downsampling_t *pdVar8;
  gau_select_t *pgVar9;
  int32 best_cid;
  int32 iVar10;
  int iVar11;
  gmm_select_t *pgVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  int local_98;
  int local_94;
  int32 single_el_list [2];
  
  single_el_list[0] = -1;
  single_el_list[1] = -1;
  svq_beam = fastgmm->gaus->subvqbeam;
  piVar3 = fastgmm->gmms->ci_occu;
  psVar4 = mdef->cd2cisen;
  senscr = a->senscr;
  puVar5 = a->sen_active;
  puVar6 = a->rec_sen_active;
  ptmr_start(tm_ovrhd);
  if (gs == (gs_t *)0x0) {
    best_cid = -1;
  }
  else {
    best_cid = gc_compute_closest_cw(gs,feat);
  }
  if (svq != (subvq_t *)0x0) {
    subvq_gautbl_eval_logs3(svq,feat,logmath);
  }
  pgVar12 = fastgmm->gmms;
  if (pgVar12->max_cd < mdef->n_sen - mdef->n_ci_sen) {
    ci = cache_ci_senscr;
    __base = pgVar12->idx;
    if (0 < g->n_mgau) {
      lVar14 = 0;
      do {
        iVar10 = mdef_is_cisenone(mdef,(s3senid_t)lVar14);
        if (iVar10 == 0) {
          if ((puVar5 == (uint8 *)0x0) || (puVar5[lVar14] != '\0')) {
            piVar3[psVar4[lVar14]] = piVar3[psVar4[lVar14]] + 1;
          }
        }
        else {
          piVar3[lVar14] = 0;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < g->n_mgau);
    }
    iVar11 = mdef->n_ci_sen;
    if (0 < iVar11) {
      lVar14 = 0;
      do {
        __base[lVar14] = (int)lVar14;
        lVar14 = lVar14 + 1;
        iVar11 = mdef->n_ci_sen;
      } while (lVar14 < iVar11);
    }
    qsort(__base,(long)iVar11,4,intcmp);
    iVar11 = cache_ci_senscr[*__base];
    pgVar7 = fastgmm->gmms;
    pgVar12 = (gmm_select_t *)&pgVar7->dyn_ci_pbeam;
    pgVar7->dyn_ci_pbeam = pgVar7->ci_pbeam;
    if (0 < (long)mdef->n_ci_sen) {
      lVar14 = 0;
      iVar15 = 0;
      do {
        if (cache_ci_senscr[__base[lVar14]] <= pgVar7->ci_pbeam + iVar11) break;
        iVar15 = iVar15 + piVar3[__base[lVar14]];
        if (pgVar7->max_cd < iVar15) {
          *(int32 *)pgVar12 = cache_ci_senscr[__base[lVar14]] - iVar11;
          break;
        }
        lVar14 = lVar14 + 1;
      } while (mdef->n_ci_sen != lVar14);
    }
  }
  iVar11 = pgVar12->ci_pbeam;
  fVar1 = (float)fastgmm->gmms->tighten_factor;
  ptmr_stop(tm_ovrhd);
  pdVar8 = fastgmm->downs;
  iVar15 = pdVar8->ds_ratio;
  if (iVar15 == 0) {
    __assert_fail("fg->downs->ds_ratio != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/approx_cont_mgau.c"
                  ,0x73,"int32 approx_isskip(int32, fast_gmm_t *, int32)");
  }
  pgVar9 = fastgmm->gaus;
  if ((0 < pdVar8->cond_ds) && (0 < pdVar8->dist_ds)) {
    __assert_fail("!(cond_ds > 0 && dist_ds > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/approx_cont_mgau.c"
                  ,0x74,"int32 approx_isskip(int32, fast_gmm_t *, int32)");
  }
  if (pdVar8->cond_ds < 1) {
    bVar17 = frame % iVar15 == 0;
  }
  else {
    bVar17 = true;
    if (pgVar9->rec_bstcid == best_cid) {
      if (pdVar8->skip_count < iVar15 + -1) {
        pdVar8->skip_count = pdVar8->skip_count + 1;
        bVar17 = false;
      }
      else {
        pdVar8->skip_count = 0;
      }
    }
  }
  pgVar9->rec_bstcid = best_cid;
  iVar15 = (int)(fVar1 * (float)iVar11);
  if (bVar17 != false) {
    iVar15 = iVar11;
  }
  if (g->n_mgau < 1) {
    iVar11 = -0x80000000;
    local_98 = 0;
    local_94 = 0;
  }
  else {
    lVar14 = 0;
    iVar11 = -0x80000000;
    lVar16 = 6;
    local_94 = 0;
    local_98 = 0;
    iVar13 = -0x80000000;
    do {
      if (puVar5 == (uint8 *)0x0) {
        bVar18 = true;
      }
      else {
        bVar18 = puVar5[lVar14] != '\0';
      }
      iVar10 = mdef_is_cisenone(mdef,(s3senid_t)lVar14);
      if (iVar10 == 0) {
        if (bVar18) {
          if (senscr[psVar4[lVar14]] < iVar15 + iVar13) {
            iVar2 = *(int *)((long)g->mgau + lVar16 * 2 + -8);
            if ((iVar2 == -1) || (*(int *)((long)&g->mgau->n_comp + lVar16 * 2) != frame + -1)) {
              senscr[lVar14] = senscr[psVar4[lVar14]];
            }
            else {
              single_el_list[0] = iVar2;
              iVar10 = mgau_eval(g,(int32)lVar14,single_el_list,feat,frame,(uint)(bVar17 ^ 1));
              senscr[lVar14] = iVar10;
              local_98 = local_98 + 1;
            }
          }
          else {
            iVar10 = approx_mgau_eval(gs,svq,g,fastgmm,(int32)lVar14,senscr,feat,best_cid,svq_beam,
                                      frame);
            local_98 = local_98 + iVar10;
            local_94 = local_94 + 1;
          }
          if (iVar11 <= senscr[lVar14]) {
            iVar11 = senscr[lVar14];
          }
        }
      }
      else {
        iVar2 = cache_ci_senscr[lVar14];
        senscr[lVar14] = iVar2;
        if (iVar13 <= iVar2) {
          iVar13 = iVar2;
        }
        if (iVar11 <= iVar2) {
          iVar11 = iVar2;
        }
        puVar5[lVar14] = '\x01';
      }
      puVar6[lVar14] = puVar5[lVar14];
      lVar14 = lVar14 + 1;
      lVar16 = lVar16 + 0x20;
    } while (lVar14 < g->n_mgau);
  }
  if (0 < g->n_mgau) {
    lVar14 = 0;
    do {
      if (puVar5[lVar14] != '\0') {
        senscr[lVar14] = senscr[lVar14] - iVar11;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < g->n_mgau);
  }
  g->frm_sen_eval = local_94;
  g->frm_gau_eval = local_98;
  return iVar11;
}

Assistant:

int32
approx_cont_mgau_frame_eval(mdef_t * mdef,
                            subvq_t * svq,
                            gs_t * gs,
                            mgau_model_t * g,
                            fast_gmm_t * fastgmm,
                            ascr_t * a,
                            float32 * feat,
                            int32 frame,
                            int32 * cache_ci_senscr,
                            ptmr_t * tm_ovrhd,
                            logmath_t * logmath)
{
    int32 s;
    int32 best, ns, ng, n_cis, n_cig;
    int32 best_cid;
    int32 is_skip;
    int32 is_compute;
    int32 pbest;
    int32 is_ciphone;
    int32 svq_beam;
    int32 *ci_occ;
    s3senid_t *cd2cisen;

    int32 total;
    int32 dyn_ci_pbeam;
    float32 tighten_factor;

    int32 single_el_list[2];
    uint8 *sen_active;
    uint8 *rec_sen_active;
    int32 *senscr;

    best = MAX_NEG_INT32;
    pbest = MAX_NEG_INT32;
    ns = 0;
    n_cis = 0;
    n_cig = 0;
    ng = 0;
    total = 0;
    best_cid = -1;


    single_el_list[0] = -1;
    single_el_list[1] = -1;
    svq_beam = fastgmm->gaus->subvqbeam;

    ci_occ = fastgmm->gmms->ci_occu;
    cd2cisen = mdef_cd2cisen(mdef);

    sen_active = a->sen_active;
    rec_sen_active = a->rec_sen_active;
    senscr = a->senscr;

    ptmr_start(tm_ovrhd);
    if (gs)
        best_cid = gc_compute_closest_cw(gs, feat);
    if (svq)
        subvq_gautbl_eval_logs3(svq, feat, logmath);

    if (fastgmm->gmms->max_cd < mdef->n_sen - mdef->n_ci_sen)
        dyn_ci_pbeam = approx_compute_dyn_ci_pbeam(mdef, fastgmm, g,
                                                   ci_occ, sen_active,
                                                   cache_ci_senscr,
                                                   cd2cisen);
    else
        dyn_ci_pbeam = fastgmm->gmms->ci_pbeam;

    tighten_factor = fastgmm->gmms->tighten_factor;

    ptmr_stop(tm_ovrhd);

    is_skip = approx_isskip(frame, fastgmm, best_cid);
    fastgmm->gaus->rec_bstcid = best_cid;

    /* Use the original */

    /* If the frame is "skipped", tighten the beam. */
    if (is_skip) {
        dyn_ci_pbeam = (int32) ((float32) dyn_ci_pbeam * tighten_factor);
    }

    for (s = 0; s < g->n_mgau; s++) {
        is_compute = !sen_active || sen_active[s];
        is_ciphone = mdef_is_cisenone(mdef, s);

#if 0
        if (sen_active[s])
            E_INFO
                ("Sen active %d, rec_sen_active %d, sen id %d cisen id %d, best index %d, update time %d\n",
                 sen_active[s], rec_sen_active[s], s, cd2cisen[s],
                 g->mgau[s].bstidx, g->mgau[s].updatetime);
#endif

        /* Compute the score of the CI phone even if it is not active. */
        if (is_ciphone) {
            /*Just copied from the cache, we just do accouting here */
            /*E_INFO("At senone %d, CI phoneme score %d \n",s,cache_ci_senscr[s]); */
            senscr[s] = cache_ci_senscr[s];
            if (pbest < senscr[s])
                pbest = senscr[s];
            if (best < senscr[s])
                best = senscr[s];
            sen_active[s] = 1;
        }
        else {
            if (is_compute) {
                if ((senscr[cd2cisen[s]] >= pbest + dyn_ci_pbeam)) {
                    ng +=
                        approx_mgau_eval(gs, svq, g, fastgmm, s, senscr,
                                         feat, best_cid, svq_beam, frame);
                    ns++;
                }
                else {

                    /* 3.6 logic: 
                       Whenever it is possible, CD senone score is backed off to the
                       score computed by the best matching index. Otherwise, CI
                       scores will be used.
                     */
                    if (g->mgau[s].bstidx == NO_BSTIDX ||       /* If the gaussian was not computed before. or */
                        g->mgau[s].updatetime != frame - 1      /* It the gaussian was not updated in last frame */
                        ) {
                        /*Previous frames, senone s is not computed. 
                           or the best index is not trusted. 
                           Use CI score in these cases. */
#ifdef GAUDEBUG
                        E_INFO
                            ("USE CI SENONE SCORE at senone %d time %d\n",
                             s, frame);
#endif

                        senscr[s] = senscr[cd2cisen[s]];

                    }
                    else {
                        /*Don't change the bstidx and updatetime */
                        single_el_list[0] = g->mgau[s].bstidx;

                        /*ARCHAN: Please don't rewrite this two lines. I want to make a contrast between the two situations. */
                        if (is_skip)
                            senscr[s] = mgau_eval(g, s, single_el_list, feat, frame, 1);        /*Update the best idx, such that next frames can use it */
                        else
                            senscr[s] = mgau_eval(g, s, single_el_list, feat, frame, 0);        /*Not update the best index in a Gaussian */

                        ng++;   /* But don't increase the number of senone compute. It doesn't count. */

#ifdef GAUDEBUG
                        E_INFO
                            ("RECOMPUTE for senone %d USING BEST INDEX %d time %d, single Gauss score %d, ci score %d, last ci score %d. \n",
                             s, g->mgau[s].bstidx, frame, senscr[s],
                             senscr[cd2cisen[s]], g->mgau[s].bstscr);
#endif

                    }
                }
                if (best < senscr[s])
                    best = senscr[s];
            }
        }
        /*Make a copy to the most recent active list */
        rec_sen_active[s] = sen_active[s];
    }

    for (s = 0; s < g->n_mgau; s++) {
        if (sen_active[s])
            senscr[s] -= best;
    }


    /*Don't delete this line, it is very useful in analysing the performance */

#if APPROX_ANALYSE
    E_INFO("time: %d , cisen %d, sen: %d, gau: %d\n", frame, n_cis, ns,
           ng);
#endif

    g->frm_sen_eval = ns;
    g->frm_gau_eval = ng;
    ci_occ = NULL;
    return best;


}